

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

Expr * __thiscall SQCompilation::SQParser::BitwiseXorExp(SQParser *this)

{
  Expr *f;
  long in_RDI;
  Expr *lhs;
  NestingChecker nc;
  SQParser *in_stack_ffffffffffffff98;
  NestingChecker *in_stack_ffffffffffffffa0;
  Expr *in_stack_ffffffffffffffd0;
  TreeOp in_stack_ffffffffffffffdc;
  SQParser *in_stack_fffffffffffffff0;
  
  NestingChecker::NestingChecker(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  f = BitwiseAndExp(in_stack_fffffffffffffff0);
  while( true ) {
    NestingChecker::inc(in_stack_ffffffffffffffa0);
    if (*(long *)(in_RDI + 0x18) != 0x5e) break;
    f = BIN_EXP<SQCompilation::Expr*(SQCompilation::SQParser::*)()>
                  (in_stack_fffffffffffffff0,(offset_in_SQParser_to_subr)f,in_stack_ffffffffffffffdc
                   ,in_stack_ffffffffffffffd0);
  }
  NestingChecker::~NestingChecker((NestingChecker *)&stack0xffffffffffffffe8);
  return f;
}

Assistant:

Expr* SQParser::BitwiseXorExp()
{
    NestingChecker nc(this);
    Expr * lhs = BitwiseAndExp();
    for (;;) {
        nc.inc();
        if (_token == _SC('^')) {
            lhs = BIN_EXP(&SQParser::BitwiseAndExp, TO_XOR, lhs);
        }
        else return lhs;
    }
}